

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::EmitterBeam::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EmitterBeam *this)

{
  pointer pTVar1;
  KString *pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KUINT16 Tabs_02;
  KINT32 Value;
  KINT32 Value_00;
  pointer pTVar4;
  KStringStream ss;
  KString local_2c0;
  KString local_2a0;
  KString *local_280;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_280 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Emitter Beam:\n\t",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"\n\tBeam Data Length (32bits):        ",0x24);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\n\tEmitter Beam ID Number:           ",0x24);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\n\tBeam Parameter Index:             ",0x24);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  FundamentalParameterData::GetAsString_abi_cxx11_(&local_2a0,&this->m_FundamentalParameterData);
  UTILS::IndentString(&local_2c0,&local_2a0,Tabs,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tBeam Function:                    ",0x23);
  ENUMS::GetEnumAsStringEmitterFunction_abi_cxx11_
            (&local_218,(ENUMS *)(ulong)this->m_ui8BeamFunction,Value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\n\tNumber Of Targets Tracked/Jammed: ",0x24);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\n\tHigh Density Track/Jam:           ",0x24);
  ENUMS::GetEnumAsStringHighDensityTrackJam_abi_cxx11_
            (&local_238,(ENUMS *)(ulong)this->m_ui8HighDensityTrackJam,Value_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_238._M_dataplus._M_p,local_238._M_string_length);
  BeamStatus::GetAsString_abi_cxx11_(&local_1d8,&this->m_BeamStatus);
  UTILS::IndentString(&local_258,&local_1d8,Tabs_00,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_258._M_dataplus._M_p,local_258._M_string_length);
  JammingTechnique::GetAsString_abi_cxx11_(&local_1f8,&this->m_JammingTechnique);
  UTILS::IndentString(&local_278,&local_1f8,Tabs_01,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tTracked/Jammed Targets:\n",0x1a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar4 != pTVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Target:\n",8);
      (*(pTVar4->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
        _vptr_DataTypeBase[2])(&local_2a0,pTVar4);
      UTILS::IndentString(&local_2c0,&local_2a0,Tabs_02,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
  }
  pKVar2 = local_280;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString EmitterBeam::GetAsString() const
{
    KStringStream ss;

    ss << "Emitter Beam:\n\t"
       << "\n\tBeam Data Length (32bits):        " << ( KUINT16 )m_ui8BeamDataLength
       << "\n\tEmitter Beam ID Number:           " << ( KUINT16 )m_ui8EmitterBeamIDNumber
       << "\n\tBeam Parameter Index:             " << m_ui16BeamParamIndex
       << IndentString( m_FundamentalParameterData.GetAsString(), 1 )
       << "\tBeam Function:                    "   << GetEnumAsStringEmitterFunction( m_ui8BeamFunction )
       << "\n\tNumber Of Targets Tracked/Jammed: " << ( KUINT16 )m_ui8NumTargetInTrackJamField
       << "\n\tHigh Density Track/Jam:           " <<  GetEnumAsStringHighDensityTrackJam( m_ui8HighDensityTrackJam )
#if DIS_VERSION < 7
       << "\n\tJamming Mode Sequence:            " << m_ui32JammingModeSequence
#elif DIS_VERSION > 6
       << IndentString( m_BeamStatus.GetAsString(), 1 )
       << IndentString( m_JammingTechnique.GetAsString(), 1 )
#endif
       << "\n\tTracked/Jammed Targets:\n";

    vector<TrackJamTargetIdentifier>::const_iterator citr = m_vTrackJamTargets.begin();
    vector<TrackJamTargetIdentifier>::const_iterator citrEnd = m_vTrackJamTargets.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << "Target:\n"
           << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}